

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::StartDocument(cmXMLWriter *this,char *encoding)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<?xml version=\"1.0\" encoding=\"",0x1e);
  if (encoding == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(encoding);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,encoding,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"?>",3);
  return;
}

Assistant:

void cmXMLWriter::StartDocument(const char* encoding)
{
  this->Output << R"(<?xml version="1.0" encoding=")" << encoding << "\"?>";
}